

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O1

int dwarf_offset_list(Dwarf_Debug dbg,Dwarf_Off offset,Dwarf_Bool is_info,Dwarf_Off **offbuf,
                     Dwarf_Unsigned *offcnt,Dwarf_Error *error)

{
  Dwarf_Off *pDVar1;
  bool bVar2;
  int iVar3;
  Dwarf_Off *pDVar4;
  Dwarf_Die die_00;
  Dwarf_Unsigned DVar5;
  Dwarf_Off *pDVar6;
  Dwarf_Unsigned DVar7;
  Dwarf_Chain_2_conflict head_chain;
  Dwarf_Die die;
  Dwarf_Die sib_die;
  Dwarf_Die child;
  Dwarf_Off cur_off;
  Dwarf_Off *local_68;
  Dwarf_Die local_60;
  Dwarf_Unsigned local_58;
  Dwarf_Die local_50;
  Dwarf_Die local_48;
  Dwarf_Off *local_40;
  Dwarf_Off local_38;
  
  local_60 = (Dwarf_Die)0x0;
  local_48 = (Dwarf_Die)0x0;
  local_50 = (Dwarf_Die)0x0;
  local_68 = (Dwarf_Off *)0x0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_offset_list()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  *offbuf = (Dwarf_Off *)0x0;
  *offcnt = 0;
  iVar3 = dwarf_offdie_b(dbg,offset,is_info,&local_60,error);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = dwarf_child(local_60,&local_48,error);
  if (iVar3 == -1) {
    return -1;
  }
  if (iVar3 == 1) {
    return 1;
  }
  dwarf_dealloc_die(local_60);
  die_00 = local_48;
  local_48 = (Dwarf_Die)0x0;
  local_58 = 0;
  local_40 = (Dwarf_Off *)&local_68;
  do {
    if (iVar3 == 0) {
      local_38 = 0;
      iVar3 = dwarf_dieoffset(die_00,&local_38,error);
      pDVar6 = local_68;
      if (iVar3 == 0) {
        pDVar4 = (Dwarf_Off *)_dwarf_get_alloc(dbg,'=',1);
        pDVar6 = local_68;
        if (pDVar4 == (Dwarf_Off *)0x0) {
          while (pDVar6 != (Dwarf_Off *)0x0) {
            pDVar4 = (Dwarf_Off *)pDVar6[1];
            dwarf_dealloc(dbg,pDVar6,0x3d);
            pDVar6 = pDVar4;
          }
          dwarf_dealloc_die(die_00);
          _dwarf_error(dbg,error,0x3e);
          goto LAB_00181435;
        }
        *pDVar4 = local_38;
        local_58 = local_58 + 1;
        *local_40 = (Dwarf_Off)pDVar4;
        local_40 = pDVar4 + 1;
        bVar2 = true;
      }
      else {
        while (pDVar6 != (Dwarf_Off *)0x0) {
          pDVar4 = (Dwarf_Off *)pDVar6[1];
          dwarf_dealloc(dbg,pDVar6,0x3d);
          pDVar6 = pDVar4;
        }
        dwarf_dealloc_die(die_00);
LAB_00181435:
        bVar2 = false;
      }
      if (!bVar2) {
        return 1;
      }
    }
    local_50 = (Dwarf_Die)0x0;
    iVar3 = dwarf_siblingof_c(die_00,&local_50,error);
    if (die_00 != local_60) {
      dwarf_dealloc(dbg,die_00,8);
    }
    DVar5 = local_58;
    if (iVar3 == -1) {
      pDVar4 = (Dwarf_Off *)_dwarf_get_alloc(dbg,'\x19',local_58);
      pDVar6 = local_68;
      if (pDVar4 == (Dwarf_Off *)0x0) {
        while (pDVar6 != (Dwarf_Off *)0x0) {
          pDVar4 = (Dwarf_Off *)pDVar6[1];
          dwarf_dealloc(dbg,pDVar6,0x3d);
          pDVar6 = pDVar4;
        }
        _dwarf_error(dbg,error,0x3e);
        return 1;
      }
      if (DVar5 != 0) {
        DVar7 = 0;
        do {
          pDVar4[DVar7] = *pDVar6;
          pDVar1 = (Dwarf_Off *)pDVar6[1];
          dwarf_dealloc(dbg,pDVar6,0x3d);
          DVar7 = DVar7 + 1;
          DVar5 = local_58;
          pDVar6 = pDVar1;
        } while (local_58 != DVar7);
      }
      *offbuf = pDVar4;
      *offcnt = DVar5;
      return 0;
    }
    die_00 = local_50;
    pDVar6 = local_68;
    if (iVar3 == 1) {
      while (pDVar6 != (Dwarf_Off *)0x0) {
        pDVar4 = (Dwarf_Off *)pDVar6[1];
        dwarf_dealloc(dbg,pDVar6,0x3d);
        pDVar6 = pDVar4;
      }
      return 1;
    }
  } while( true );
}

Assistant:

int
dwarf_offset_list(Dwarf_Debug dbg,
    Dwarf_Off    offset, Dwarf_Bool      is_info,
    Dwarf_Off  **offbuf, Dwarf_Unsigned *offcnt,
    Dwarf_Error *error)
{
    Dwarf_Die die = 0;
    Dwarf_Die child = 0;
    Dwarf_Die sib_die = 0;
    Dwarf_Die cur_die = 0;
    int       res = 0;
    Dwarf_Unsigned off_count = 0;
    Dwarf_Unsigned i = 0;
    Dwarf_Off    *ret_offsets = 0;
    Dwarf_Chain_2 curr_chain = 0;
    Dwarf_Chain_2 head_chain = 0;
    Dwarf_Chain_2 *plast = &head_chain;

    CHECK_DBG(dbg,error,"dwarf_offset_list()");
    *offbuf = NULL;
    *offcnt = 0;
    res = dwarf_offdie_b(dbg,offset,is_info,&die,error);
    if (DW_DLV_OK != res) {
        return res;
    }

    res = dwarf_child(die,&child,error);
    if (DW_DLV_ERROR == res || DW_DLV_NO_ENTRY == res) {
        return res;
    }
    dwarf_dealloc_die(die);
    cur_die = child;
    child = 0;
    for (;;) {
        if (DW_DLV_OK == res) {
            int dres = 0;
            Dwarf_Off cur_off = 0;

            dres = dwarf_dieoffset(cur_die,&cur_off,error);
            if (dres == DW_DLV_OK) {
                /* Normal. use cur_off. */
            } else if (dres == DW_DLV_ERROR) {
                free_dwarf_offsets_chain(dbg,head_chain);
                dwarf_dealloc_die(cur_die);
                return DW_DLV_ERROR;
            } else { /* DW_DLV_NO_ENTRY */
                /* Impossible, dwarf_dieoffset never returns this */
            }
            /* Record offset in current entry chain */
            curr_chain = (Dwarf_Chain_2)_dwarf_get_alloc(
                dbg,DW_DLA_CHAIN_2,1);
            if (curr_chain == NULL) {
                free_dwarf_offsets_chain(dbg,head_chain);
                dwarf_dealloc_die(cur_die);
                _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
                return DW_DLV_ERROR;
            }

            /* Put current offset on singly_linked list. */
            curr_chain->ch_item = cur_off;
            ++off_count;
            (*plast) = curr_chain;
            plast = &(curr_chain->ch_next);
        }
        /* Move to next sibling next sibling */
        sib_die = 0;
        res = dwarf_siblingof_c(cur_die,&sib_die,error);
        if (cur_die != die) {
            dwarf_dealloc(dbg,cur_die,DW_DLA_DIE);
        }
        if (DW_DLV_ERROR == res) {
            free_dwarf_offsets_chain(dbg,head_chain);
            return res;
        }
        if (DW_DLV_NO_ENTRY == res) {
            /* Done at this level. */
            break;
        }
        /* res == DW_DLV_OK */
        cur_die = sib_die;
    }

    /* Points to contiguous block of Dwarf_Off's. */
    ret_offsets = (Dwarf_Off *) _dwarf_get_alloc(dbg,
        DW_DLA_UARRAY, off_count);
    if (ret_offsets == NULL) {
        free_dwarf_offsets_chain(dbg,head_chain);
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }

    /*  Store offsets in contiguous block,
        and deallocate the chain. */
    curr_chain = head_chain;
    for (i = 0; i < off_count; i++) {
        Dwarf_Chain_2 prev =0;

        ret_offsets[i] = curr_chain->ch_item;
        prev = curr_chain;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, DW_DLA_CHAIN_2);
    }
    *offbuf = ret_offsets;
    *offcnt = off_count;
    return DW_DLV_OK;
}